

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::create_color_selector_codebook(dxt_hc *this)

{
  vector<unsigned_int> *this_00;
  int *piVar1;
  uint uVar2;
  uint *puVar3;
  color_selector_details *pcVar4;
  color_selector_details *pcVar5;
  bool *pbVar6;
  uint s;
  unsigned_long_long *puVar7;
  vec<16U,_float> *pvVar8;
  uint t;
  uint i;
  uint i_1;
  uint uVar9;
  uint uVar10;
  unsigned_long_long uVar11;
  long lVar12;
  long lVar13;
  uint8 s_1;
  long lVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  vector<crnlib::vector<crnlib::color_selector_details>_> selector_details;
  vector<unsigned_int> weights;
  uint weight;
  vector<crnlib::vec<16U,_float>_> vectors;
  vector<crnlib::SelectorNode> nodes;
  vector<unsigned_long_long> selectors;
  SelectorNode node;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  float v [4];
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  
  uVar2 = this->m_pTask_pool->m_num_threads;
  vector<unsigned_long_long>::vector
            (&selectors,this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  bVar22 = this->m_has_subblocks;
  uVar10 = this->m_num_blocks;
  puVar7 = this->m_block_selectors[0].m_p;
  uVar18 = 0;
  for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + bVar22 + 1) {
    if (bVar22 == false) {
      uVar11 = 0;
    }
    else {
      uVar11 = puVar7[uVar9 + 1];
    }
    selectors.m_p[uVar18] = uVar11 + puVar7[uVar9];
    uVar18 = (ulong)((int)uVar18 + 1);
  }
  uVar10 = uVar2 + 1;
  node.p = (uint64 *)0x0;
  nodes.m_p = (SelectorNode *)0x0;
  nodes.m_size = 0;
  nodes.m_capacity = 0;
  node.pEnd = selectors.m_p;
  for (iVar16 = 1; iVar16 - uVar2 != 2; iVar16 = iVar16 + 1) {
    node.p = node.pEnd;
    puVar7 = selectors.m_p + (ulong)(selectors.m_size * iVar16) / (ulong)uVar10;
    bVar22 = node.pEnd != puVar7;
    node.pEnd = puVar7;
    if (bVar22) {
      vector<crnlib::SelectorNode>::push_back(&nodes,&node);
    }
  }
  lVar14 = 0;
  for (uVar18 = 0; uVar18 < (nodes._8_8_ & 0xffffffff); uVar18 = uVar18 + 1) {
    task_pool::queue_task
              (this->m_pTask_pool,SelectorNode::sort_task,uVar18,
               (void *)((long)&(nodes.m_p)->p + lVar14));
    lVar14 = lVar14 + 0x10;
  }
  task_pool::join(this->m_pTask_pool);
  queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar14 = 0;
  for (uVar18 = 0; uVar18 < (nodes._8_8_ & 0xffffffff); uVar18 = uVar18 + 1) {
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::push(&queue,(value_type *)((long)&(nodes.m_p)->p + lVar14));
    lVar14 = lVar14 + 0x10;
  }
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    v[lVar14] = ((float)(int)lVar14 + 0.5) * 0.25;
  }
  vectors.m_p = (vec<16U,_float> *)0x0;
  vectors.m_size = 0;
  vectors.m_capacity = 0;
  weights.m_p = (uint *)0x0;
  weights.m_size = 0;
  weights.m_capacity = 0;
  vector<crnlib::vec<16U,_float>_>::reserve(&vectors,selectors.m_size);
  vector<unsigned_int>::reserve(&weights,selectors.m_size);
  uVar18 = 0;
  while (queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
         _M_impl.super__Vector_impl_data._M_start) {
    selector_details._8_8_ =
         (queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
          _M_impl.super__Vector_impl_data._M_start)->pEnd;
    selector_details.m_p =
         (vector<crnlib::color_selector_details> *)
         ((queue.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
           _M_impl.super__Vector_impl_data._M_start)->p + 1);
    uVar19 = *(queue.c.
               super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
               _M_impl.super__Vector_impl_data._M_start)->p;
    std::
    priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
    ::pop(&queue);
    if (selector_details.m_p != (vector<crnlib::color_selector_details> *)selector_details._8_8_) {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push(&queue,(value_type *)&selector_details);
    }
    weight = (uint)uVar19;
    uVar19 = uVar19 >> 0x20;
    if (vectors.m_size == 0 || uVar19 != uVar18) {
      uVar18 = uVar19;
      for (lVar14 = 0xf; lVar14 != -1; lVar14 = lVar14 + -1) {
        *(float *)((long)&selector_vq.m_vectors + lVar14 * 4) = v[(uint)uVar18 & 3];
        uVar18 = uVar18 >> 2;
      }
      vector<crnlib::vec<16U,_float>_>::push_back(&vectors,(vec<16U,_float> *)&selector_vq);
      vector<unsigned_int>::push_back(&weights,&weight);
      uVar18 = uVar19;
    }
    else {
      uVar9 = weights.m_size - 1;
      if (CARRY4(weights.m_p[uVar9],weight)) {
        weights.m_p[uVar9] = 0xffffffff;
      }
      else {
        weights.m_p[uVar9] = weights.m_p[uVar9] + weight;
      }
    }
  }
  selector_vq.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  selector_vq.m_node_index_map.m_values.m_size = 0;
  selector_vq.m_node_index_map.m_values.m_capacity = 0;
  selector_vq.m_vectorComparison.m_p = (bool *)0x0;
  selector_vq.m_vectorComparison.m_size = 0;
  selector_vq.m_vectorComparison.m_capacity = 0;
  selector_vq.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  selector_vq.m_vectorsInfoRight.m_size = 0;
  selector_vq.m_vectorsInfoRight.m_capacity = 0;
  selector_vq.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  selector_vq.m_vectorsInfoLeft.m_size = 0;
  selector_vq.m_vectorsInfoLeft.m_capacity = 0;
  selector_vq.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  selector_vq.m_vectorsInfo.m_size = 0;
  selector_vq.m_vectorsInfo.m_capacity = 0;
  selector_vq.m_weightedDotProducts.m_p = (double *)0x0;
  selector_vq.m_weightedDotProducts.m_size = 0;
  selector_vq.m_weightedDotProducts.m_capacity = 0;
  selector_vq.m_weightedVectors.m_p = (vec<16U,_float> *)0x0;
  selector_vq.m_weightedVectors.m_size = 0;
  selector_vq.m_weightedVectors.m_capacity = 0;
  selector_vq.m_node_index_map.m_hash_shift = 0x20;
  selector_vq.m_node_index_map.m_num_valid = 0;
  selector_vq.m_node_index_map.m_grow_threshold = 0;
  selector_vq.m_nodes.m_p = (vq_node *)0x0;
  selector_vq.m_nodes.m_size = 0;
  selector_vq.m_nodes.m_capacity = 0;
  selector_vq.m_codebook.m_p = (vec<16U,_float> *)0x0;
  selector_vq.m_codebook.m_size = 0;
  selector_vq.m_codebook.m_capacity = 0;
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            (&selector_vq,vectors.m_p,weights.m_p,vectors.m_size,
             (this->m_params).m_color_selector_codebook_size,false,this->m_pTask_pool);
  this_00 = &this->m_color_selectors;
  vector<unsigned_int>::resize(this_00,selector_vq.m_codebook.m_size,false);
  vector<bool>::resize(&this->m_color_selectors_used,selector_vq.m_codebook.m_size,false);
  puVar3 = this_00->m_p;
  pvVar8 = selector_vq.m_codebook.m_p;
  for (uVar18 = 0; uVar18 < (selector_vq.m_codebook._8_8_ & 0xffffffff); uVar18 = uVar18 + 1) {
    puVar3[uVar18] = 0;
    uVar9 = 0;
    for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 2) {
      uVar9 = (int)(long)(*(float *)((long)pvVar8->m_s + lVar14 * 2) * 4.0) << ((byte)lVar14 & 0x1f)
              | uVar9;
    }
    puVar3[uVar18] = uVar9;
    pvVar8 = pvVar8 + 1;
  }
  vector<crnlib::vector<crnlib::color_selector_details>_>::vector(&selector_details,uVar10);
  lVar14 = 0;
  for (pvVar17 = (void *)0x0; (void *)(ulong)uVar10 != pvVar17;
      pvVar17 = (void *)((long)pvVar17 + 1)) {
    vector<crnlib::color_selector_details>::resize
              ((vector<crnlib::color_selector_details> *)
               ((long)&(selector_details.m_p)->m_p + lVar14),(this->m_color_selectors).m_size,false)
    ;
    task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
              (this->m_pTask_pool,this,0x163224,0,pvVar17);
    lVar14 = lVar14 + 0x10;
  }
  task_pool::join(this->m_pTask_pool);
  for (pvVar17 = (void *)0x1; pvVar17 < (void *)(ulong)uVar10; pvVar17 = (void *)((long)pvVar17 + 1)
      ) {
    lVar14 = 0;
    for (uVar18 = 0; uVar18 < (this->m_color_selectors).m_size; uVar18 = uVar18 + 1) {
      pcVar4 = selector_details.m_p[(long)pvVar17].m_p;
      pcVar5 = (selector_details.m_p)->m_p;
      lVar12 = (long)pcVar4->error[0] + lVar14;
      lVar13 = (long)pcVar5->error[0] + lVar14;
      for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 1) {
        for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
          piVar1 = (int *)(lVar13 + lVar15 * 4);
          *piVar1 = *piVar1 + *(int *)(lVar12 + lVar15 * 4);
        }
        lVar12 = lVar12 + 0x10;
        lVar13 = lVar13 + 0x10;
      }
      bVar22 = true;
      if (pcVar5[uVar18].used == false) {
        bVar22 = pcVar4[uVar18].used;
      }
      pcVar5[uVar18].used = bVar22;
      lVar14 = lVar14 + 0x104;
    }
  }
  pbVar6 = (this->m_color_selectors_used).m_p;
  puVar3 = this_00->m_p;
  lVar14 = 0;
  for (uVar18 = 0; uVar18 < (this->m_color_selectors).m_size; uVar18 = uVar18 + 1) {
    pcVar4 = (selector_details.m_p)->m_p;
    pbVar6[uVar18] = pcVar4[uVar18].used;
    puVar3[uVar18] = 0;
    uVar10 = 0;
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 2) {
      lVar13 = lVar12 * 8 + lVar14;
      bVar22 = *(uint *)((long)pcVar4->error[0] + lVar12 * 8 + lVar14 + 0xc) <
               *(uint *)((long)pcVar4->error[0] + lVar12 * 8 + lVar14);
      bVar21 = *(uint *)((long)pcVar4->error[0] + lVar12 * 8 + lVar14 + 8) <
               *(uint *)((long)pcVar4->error[0] + lVar12 * 8 + lVar14 + 4);
      if (*(uint *)((long)pcVar4->error[0] + (ulong)bVar21 * 4 + lVar13 + 4) <
          *(uint *)((long)pcVar4->error[0] + (ulong)((uint)bVar22 * 0xc) + lVar13)) {
        uVar9 = (uint)(byte)(bVar21 + 1);
      }
      else {
        uVar9 = (uint)bVar22 * 3;
      }
      uVar10 = uVar10 | uVar9 << ((byte)lVar12 & 0x1f);
      puVar3[uVar18] = uVar10;
    }
    lVar14 = lVar14 + 0x104;
  }
  vector<crnlib::vector<crnlib::color_selector_details>_>::~vector(&selector_details);
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer(&selector_vq);
  vector<unsigned_int>::~vector(&weights);
  vector<crnlib::vec<16U,_float>_>::~vector(&vectors);
  std::_Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>::~_Vector_base
            ((_Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_> *)&queue);
  vector<crnlib::SelectorNode>::~vector(&nodes);
  vector<unsigned_long_long>::~vector(&selectors);
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<uint64> selectors(m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks);
        for (uint i = 0, b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
        {
            selectors[i++] = m_block_selectors[cColor][b] + (m_has_subblocks ? m_block_selectors[cColor][b + 1] : 0);
        }

        crnlib::vector<SelectorNode> nodes;
        SelectorNode node(0, selectors.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<SelectorNode> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        float v[4];
        for (uint s = 0; s < 4; s++)
        {
            v[s] = (s + 0.5f) * 0.25f;
        }

        crnlib::vector<vec16F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(selectors.size());
        weights.reserve(selectors.size());
        for (uint64 prev_selector = 0; queue.size();)
        {
            SelectorNode node = queue.top();
            uint64 selector = *node.p++;
            queue.pop();
            if (node.p != node.pEnd)
            {
                queue.push(node);
            }
            uint weight = (uint)selector;
            selector >>= 32;
            if (!vectors.size() || selector != prev_selector)
            {
                prev_selector = selector;
                vec16F vector;
                for (uint p = 0; p < 16; p++, selector >>= 2)
                {
                    vector[15 - p] = v[selector & 3];
                }
                vectors.push_back(vector);
                weights.push_back(weight);
            }
            else if (weights.back() > UINT_MAX - weight)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += weight;
            }
        }

        tree_clusterizer<vec16F> selector_vq;
        selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_color_selector_codebook_size, false, m_pTask_pool);
        m_color_selectors.resize(selector_vq.get_codebook_size());
        m_color_selectors_used.resize(selector_vq.get_codebook_size());
        for (uint i = 0; i < selector_vq.get_codebook_size(); i++)
        {
            const vec16F& v = selector_vq.get_codebook_entry(i);
            m_color_selectors[i] = 0;
            for (uint sh = 0, j = 0; j < 16; j++, sh += 2)
            {
                m_color_selectors[i] |= (uint)(v[j] * 4.0f) << sh;
            }
        }

        crnlib::vector<crnlib::vector<color_selector_details>> selector_details(num_tasks);
        for (uint t = 0; t < num_tasks; t++)
        {
            selector_details[t].resize(m_color_selectors.size());
            m_pTask_pool->queue_object_task(this, &dxt_hc::create_color_selector_codebook_task, t, &selector_details[t]);
        }
        m_pTask_pool->join();

        for (uint t = 1; t < num_tasks; t++)
        {
            for (uint i = 0; i < m_color_selectors.size(); i++)
            {
                for (uint8 p = 0; p < 16; p++)
                {
                    for (uint8 s = 0; s < 4; s++)
                    {
                        selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
                    }
                }
                selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
            }
        }

        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            m_color_selectors_used[i] = selector_details[0][i].used;
            uint(&errors)[16][4] = selector_details[0][i].error;
            m_color_selectors[i] = 0;
            for (uint sh = 0, p = 0; p < 16; p++, sh += 2)
            {
                uint* e = errors[p];
                uint8 s03 = e[3] < e[0] ? 3 : 0;
                uint8 s12 = e[2] < e[1] ? 2 : 1;
                m_color_selectors[i] |= (e[s12] < e[s03] ? s12 : s03) << sh;
            }
        }
    }